

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O0

void __thiscall glTF2::Material::Material(Material *this)

{
  Material *this_local;
  
  glTF2::Object::Object(&this->super_Object);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00ee0bc0;
  PbrMetallicRoughness::PbrMetallicRoughness(&this->pbrMetallicRoughness);
  NormalTextureInfo::NormalTextureInfo(&this->normalTexture);
  OcclusionTextureInfo::OcclusionTextureInfo(&this->occlusionTexture);
  TextureInfo::TextureInfo(&this->emissiveTexture);
  std::__cxx11::string::string((string *)&this->alphaMode);
  Nullable<glTF2::PbrSpecularGlossiness>::Nullable(&this->pbrSpecularGlossiness);
  SetDefaults(this);
  return;
}

Assistant:

Material() { SetDefaults(); }